

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

int run_test_tcp_close_reset_accepted_after_shutdown(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 *extraout_RDX;
  uv_tcp_t *in_RSI;
  
  loop = uv_default_loop();
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 1;
  puVar3 = loop;
  do_connect(loop,in_RSI);
  iVar2 = (int)in_RSI;
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_0016f2b4;
    if (shutdown_cb_called != 0) goto LAB_0016f2b9;
    iVar2 = 0;
    puVar3 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016f2be;
    if (write_cb_called != 4) goto LAB_0016f2c3;
    if (close_cb_called != 0) goto LAB_0016f2c8;
    if (shutdown_cb_called != 1) goto LAB_0016f2cd;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_0016f2b4:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_0016f2b9:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_0016f2be:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_0016f2c3:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_0016f2c8:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_0016f2cd:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar2 == 0) {
      iVar2 = uv_accept((uv_stream_t *)puVar3,(uv_stream_t *)&tcp_accepted);
      if (iVar2 == 0) {
        iVar2 = uv_read_start((uv_stream_t *)&tcp_accepted,alloc_cb,read_cb);
        return iVar2;
      }
      goto LAB_0016f32e;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_0016f32e:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x336470;
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted_after_shutdown) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 1;

  do_connect(loop, &tcp_client);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);
  ASSERT(shutdown_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 4);
  ASSERT(close_cb_called == 0);
  ASSERT(shutdown_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}